

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O0

void __thiscall Movegen::encode_pawn_pushes<(Movetype)12>(Movegen *this,U64 *b,int *dir)

{
  int iVar1;
  Movetype local_2c;
  U8 local_26;
  U8 local_25;
  int local_24;
  int *piStack_20;
  int to;
  int *dir_local;
  U64 *b_local;
  Movegen *this_local;
  
  piStack_20 = dir;
  dir_local = (int *)b;
  b_local = (U64 *)this;
  while (*(long *)dir_local != 0) {
    local_24 = bits::pop_lsb((U64 *)dir_local);
    iVar1 = this->last;
    this->last = iVar1 + 1;
    local_26 = (U8)local_24;
    local_25 = local_26 + (char)*piStack_20;
    local_2c = ep;
    Move::set(this->list + iVar1,&local_25,&local_26,&local_2c);
  }
  return;
}

Assistant:

inline void Movegen::encode_pawn_pushes(U64& b, const int& dir) {
	while (b) {
		int to = bits::pop_lsb(b);
		list[last++].set(to + dir, to, mt);
	}
}